

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::GetSetParameterTest::iterate(GetSetParameterTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  GLint local_1cc;
  GLint local_1c8;
  GLint value_dst_20;
  GLint value_src_20;
  GLenum name_20;
  GLint value_dst_19;
  GLint value_src_19;
  GLenum name_19;
  GLint value_dst_18;
  GLint value_src_18;
  GLenum name_18;
  GLint value_dst_17 [4];
  GLint value_src_17 [4];
  GLint local_178;
  GLenum name_17;
  GLint value_dst_16;
  GLint value_src_16;
  GLenum name_16;
  GLint value_dst_15;
  GLint value_src_15;
  GLenum name_15;
  GLint value_dst_14;
  GLint value_src_14;
  GLenum name_14;
  GLint value_dst_13;
  GLint value_src_13;
  GLenum name_13;
  GLint value_dst_12;
  GLint value_src_12;
  GLenum name_12;
  GLint value_dst_11;
  GLint value_src_11;
  GLenum name_11;
  GLint value_dst_10;
  GLint value_src_10;
  GLenum name_10;
  GLint value_dst_9;
  GLint value_src_9;
  GLenum name_9;
  GLint value_dst_8;
  GLint value_src_8;
  GLenum name_8;
  GLfloat value_dst_7;
  GLfloat value_src_7;
  GLenum name_7;
  GLint value_dst_6;
  GLint value_src_6;
  GLenum name_6;
  GLint value_dst_5;
  GLint value_src_5;
  GLenum name_5;
  GLuint value_dst_4 [4];
  GLuint value_src_4 [4];
  GLint GStack_b8;
  GLenum name_4;
  GLint value_dst_3 [4];
  GLint value_src_3 [4];
  GLfloat GStack_88;
  GLenum name_3;
  GLfloat value_dst_2 [4];
  GLfloat value_src_2 [4];
  GLint local_5c;
  GLenum name_2;
  GLint value_dst_1;
  GLint value_src_1;
  GLenum name_1;
  GLint value_dst;
  GLint value_src;
  GLenum name;
  int local_34;
  byte local_2f;
  byte local_2e;
  undefined1 local_2d;
  GLuint texture;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  GetSetParameterTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar4->_vptr_RenderContext[2])();
  texture = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)texture);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    local_2e = 1;
    local_2f = 0;
    local_34 = 0;
    (**(code **)(lStack_20 + 0x6f8))(1,&local_34);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1654);
    (**(code **)(lStack_20 + 0xb8))(0x806f,local_34);
    dVar3 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar3,"glBindTexture has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1657);
    value_dst = 0x90ea;
    name_1 = 0x1902;
    value_src_1 = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x90ea,0x1902);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst,&value_src_1);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_1,value_src_1,value_dst);
    local_2e = bVar1 & local_2e;
    value_dst_1 = 0x813c;
    name_2 = 2;
    local_5c = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x813c,2);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_1);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_1,&local_5c);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_1);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_2,local_5c,value_dst_1);
    local_2e = bVar1 & local_2e;
    value_dst_2[2] = 0.25;
    value_dst_2[3] = 0.5;
    _GStack_88 = 0;
    value_dst_2[0] = 0.0;
    value_dst_2[1] = 0.0;
    (**(code **)(lStack_20 + 0x1420))(local_34,0x1004,value_dst_2 + 2);
    bVar1 = CheckErrorAndLog(this,"glTextureParameterfv",0x1004);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb00))(local_34,0x1004,&GStack_88);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameterfv",0x1004);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,value_dst_2 + 2,&GStack_88,0x1004);
    local_2e = bVar1 & local_2e;
    value_dst_3[2] = 0;
    value_dst_3[3] = 0x40;
    _GStack_b8 = 0;
    value_dst_3[0] = 0;
    value_dst_3[1] = 0;
    (**(code **)(lStack_20 + 0x1408))(local_34,0x1004,value_dst_3 + 2);
    bVar1 = CheckErrorAndLog(this,"glTextureParameterIiv",0x1004);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xaf0))(local_34,0x1004,&GStack_b8);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameterIiv",0x1004);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,value_dst_3 + 2,&GStack_b8,0x1004);
    local_2e = bVar1 & local_2e;
    value_dst_4[2] = 0;
    value_dst_4[3] = 0x40;
    _value_src_5 = 0;
    value_dst_4[0] = 0;
    value_dst_4[1] = 0;
    (**(code **)(lStack_20 + 0x1410))(local_34,0x1004,value_dst_4 + 2);
    bVar1 = CheckErrorAndLog(this,"glTextureParameterIuiv",0x1004);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xaf8))(local_34,0x1004,&value_src_5);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameterIuiv",0x1004);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,value_dst_4 + 2,(GLuint *)&value_src_5,0x1004);
    local_2e = bVar1 & local_2e;
    value_dst_5 = 0x884d;
    name_6 = 0x203;
    value_src_6 = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x884d,0x203);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_5);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_5,&value_src_6);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_5);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_6,value_src_6,value_dst_5);
    local_2e = bVar1 & local_2e;
    value_dst_6 = 0x884c;
    name_7 = 0x884e;
    value_src_7 = 0.0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x884c,0x884e);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_6);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_6,&value_src_7);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_6);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_7,(GLint)value_src_7,value_dst_6);
    local_2e = bVar1 & local_2e;
    value_dst_7 = 4.77128e-41;
    name_8 = 0xc0000000;
    value_src_8 = 0;
    (**(code **)(lStack_20 + 0x1418))(0xc0000000,local_34,0x8501);
    bVar1 = CheckErrorAndLog(this,"glTextureParameterf",(GLenum)value_dst_7);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb00))(local_34,value_dst_7,&value_src_8);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameterfv",(GLenum)value_dst_7);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,(GLfloat)name_8,(GLfloat)value_src_8,(GLenum)value_dst_7);
    local_2e = bVar1 & local_2e;
    value_dst_8 = 0x2801;
    name_9 = 0x2701;
    value_src_9 = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x2801,0x2701);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_8);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_8,&value_src_9);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_8);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_9,value_src_9,value_dst_8);
    local_2e = bVar1 & local_2e;
    value_dst_9 = 0x2800;
    name_10 = 0x2600;
    value_src_10 = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x2800,0x2600);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_9);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_9,&value_src_10);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_9);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_10,value_src_10,value_dst_9);
    local_2e = bVar1 & local_2e;
    value_dst_10 = 0x813a;
    name_11 = 0xffffff9c;
    value_src_11 = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x813a,0xffffff9c);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_10);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_10,&value_src_11);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_10);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_11,value_src_11,value_dst_10);
    local_2e = bVar1 & local_2e;
    value_dst_11 = 0x813b;
    name_12 = 100;
    value_src_12 = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x813b,100);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_11);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_11,&value_src_12);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_11);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_12,value_src_12,value_dst_11);
    local_2e = bVar1 & local_2e;
    value_dst_12 = 0x813d;
    name_13 = 100;
    value_src_13 = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x813d,100);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_12);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_12,&value_src_13);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_12);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_13,value_src_13,value_dst_12);
    local_2e = bVar1 & local_2e;
    value_dst_13 = 0x8e42;
    name_14 = 0x1905;
    value_src_14 = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x8e42,0x1905);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_13);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_13,&value_src_14);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_13);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_14,value_src_14,value_dst_13);
    local_2e = bVar1 & local_2e;
    value_dst_14 = 0x8e43;
    name_15 = 0x1906;
    value_src_15 = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x8e43,0x1906);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_14);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_14,&value_src_15);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_14);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_15,value_src_15,value_dst_14);
    local_2e = bVar1 & local_2e;
    value_dst_15 = 0x8e44;
    name_16 = 0x1903;
    value_src_16 = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x8e44,0x1903);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_15);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_15,&value_src_16);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_15);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_16,value_src_16,value_dst_15);
    local_2e = bVar1 & local_2e;
    value_dst_16 = 0x8e45;
    name_17 = 0x1904;
    local_178 = 0;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x8e45,0x1904);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_16);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_16,&local_178);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_16);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_17,local_178,value_dst_16);
    local_2e = bVar1 & local_2e;
    value_dst_17[2] = 0;
    value_dst_17[3] = 1;
    _value_src_18 = 0;
    value_dst_17[0] = 0;
    value_dst_17[1] = 0;
    (**(code **)(lStack_20 + 0x1430))(local_34,0x8e46,value_dst_17 + 2);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",0x8e46);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,0x8e46,&value_src_18);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",0x8e46);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,value_dst_17 + 2,&value_src_18,0x8e46);
    local_2e = bVar1 & local_2e;
    value_dst_18 = 0x2802;
    name_19 = 0x8743;
    value_src_19 = 0xb;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x2802,0x8743);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_18);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_18,&value_src_19);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_18);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_19,value_src_19,value_dst_18);
    local_2e = bVar1 & local_2e;
    value_dst_19 = 0x2803;
    name_20 = 0x812f;
    value_src_20 = 0xb;
    (**(code **)(lStack_20 + 0x1428))(local_34,0x2803,0x812f);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_19);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_19,&value_src_20);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_19);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,name_20,value_src_20,value_dst_19);
    local_2e = bVar1 & local_2e;
    value_dst_20 = 0x8072;
    local_1c8 = 0x812f;
    local_1cc = 0xb;
    (**(code **)(lStack_20 + 0x1430))(local_34,0x8072,&local_1c8);
    bVar1 = CheckErrorAndLog(this,"glTextureParameteri",value_dst_20);
    local_2e = bVar1 & local_2e;
    (**(code **)(lStack_20 + 0xb08))(local_34,value_dst_20,&local_1cc);
    bVar1 = CheckErrorAndLog(this,"glGetTextureParameteriv",value_dst_20);
    local_2e = bVar1 & local_2e;
    bVar1 = CompareAndLog(this,local_1c8,local_1cc,value_dst_20);
    local_2e = (local_2e & 1 & bVar1) != 0;
    if (local_34 != 0) {
      (**(code **)(lStack_20 + 0x480))(1);
    }
    do {
      iVar2 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar2 != 0);
    if ((local_2e & 1) == 0) {
      if ((local_2f & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetSetParameterTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Texture. */
	glw::GLuint texture = 0;

	try
	{
		gl.genTextures(1, &texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		gl.bindTexture(GL_TEXTURE_3D, texture);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

		{
			glw::GLenum name	  = GL_DEPTH_STENCIL_TEXTURE_MODE;
			glw::GLint  value_src = GL_DEPTH_COMPONENT;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_BASE_LEVEL;
			glw::GLint  value_src = 2;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum  name		  = GL_TEXTURE_BORDER_COLOR;
			glw::GLfloat value_src[4] = { 0.25, 0.5, 0.75, 1.0 };
			glw::GLfloat value_dst[4] = {};

			gl.textureParameterfv(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameterfv", name);

			gl.getTextureParameterfv(texture, name, value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameterfv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name		 = GL_TEXTURE_BORDER_COLOR;
			glw::GLint  value_src[4] = { 0, 64, -64, -32 };
			glw::GLint  value_dst[4] = {};

			gl.textureParameterIiv(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameterIiv", name);

			gl.getTextureParameterIiv(texture, name, value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameterIiv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name		 = GL_TEXTURE_BORDER_COLOR;
			glw::GLuint value_src[4] = { 0, 64, 128, 192 };
			glw::GLuint value_dst[4] = {};

			gl.textureParameterIuiv(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameterIuiv", name);

			gl.getTextureParameterIuiv(texture, name, value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameterIuiv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_COMPARE_FUNC;
			glw::GLint  value_src = GL_LEQUAL;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_COMPARE_MODE;
			glw::GLint  value_src = GL_COMPARE_REF_TO_TEXTURE;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum  name	  = GL_TEXTURE_LOD_BIAS;
			glw::GLfloat value_src = -2.f;
			glw::GLfloat value_dst = 0.f;

			gl.textureParameterf(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameterf", name);

			gl.getTextureParameterfv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameterfv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MIN_FILTER;
			glw::GLint  value_src = GL_LINEAR_MIPMAP_NEAREST;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAG_FILTER;
			glw::GLint  value_src = GL_NEAREST;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MIN_LOD;
			glw::GLint  value_src = -100;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAX_LOD;
			glw::GLint  value_src = 100;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_MAX_LEVEL;
			glw::GLint  value_src = 100;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_R;
			glw::GLint  value_src = GL_BLUE;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_G;
			glw::GLint  value_src = GL_ALPHA;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_B;
			glw::GLint  value_src = GL_RED;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_SWIZZLE_A;
			glw::GLint  value_src = GL_GREEN;
			glw::GLint  value_dst = 0;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name		 = GL_TEXTURE_SWIZZLE_RGBA;
			glw::GLint  value_src[4] = { GL_ZERO, GL_ONE, GL_ZERO, GL_ONE };
			glw::GLint  value_dst[4] = {};

			gl.textureParameteriv(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_S;
			glw::GLint  value_src = GL_MIRROR_CLAMP_TO_EDGE;
			glw::GLint  value_dst = 11;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_T;
			glw::GLint  value_src = GL_CLAMP_TO_EDGE;
			glw::GLint  value_dst = 11;

			gl.textureParameteri(texture, name, value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}

		{
			glw::GLenum name	  = GL_TEXTURE_WRAP_R;
			glw::GLint  value_src = GL_CLAMP_TO_EDGE;
			glw::GLint  value_dst = 11;

			gl.textureParameteriv(texture, name, &value_src);
			is_ok &= CheckErrorAndLog("glTextureParameteri", name);

			gl.getTextureParameteriv(texture, name, &value_dst);
			is_ok &= CheckErrorAndLog("glGetTextureParameteriv", name);

			is_ok &= CompareAndLog(value_src, value_dst, name);
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture)
	{
		gl.deleteTextures(1, &texture);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}